

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doit.cpp
# Opt level: O1

void getcoverages(vector<float,_std::allocator<float>_> *coverages)

{
  undefined8 in_RAX;
  FILE *__stream;
  ulong uVar1;
  size_t sVar2;
  int iVar3;
  char *__ptr;
  long lVar4;
  OASIS_FLOAT tiv;
  undefined8 uStack_28;
  
  __ptr = "input/coverages.bin";
  iVar3 = 0x10a1be;
  uStack_28 = in_RAX;
  __stream = fopen("input/coverages.bin","rb");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    uVar1 = ftell(__stream);
    fseek(__stream,0,0);
    std::vector<float,_std::allocator<float>_>::resize(coverages,(ulong)((int)(uVar1 >> 2) + 1));
    lVar4 = 4;
    sVar2 = fread((void *)((long)&uStack_28 + 4),4,1,__stream);
    if (sVar2 != 0) {
      do {
        *(undefined4 *)
         ((long)(coverages->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_start + lVar4) = uStack_28._4_4_;
        sVar2 = fread((void *)((long)&uStack_28 + 4),4,1,__stream);
        lVar4 = lVar4 + 4;
      } while (sVar2 != 0);
    }
    fclose(__stream);
    return;
  }
  getcoverages();
  fread(__ptr,1,(long)iVar3,_stdin);
  return;
}

Assistant:

void getcoverages(std::vector<OASIS_FLOAT> &coverages)
{
	FILE *fin = fopen(COVERAGES_FILE, "rb");
	if (fin == NULL) {
		fprintf(stderr, "FATAL: %s: Error reading file %s\n", __func__, COVERAGES_FILE);
		exit(-1);
	}

	flseek(fin, 0L, SEEK_END);
	long long sz = fltell(fin);
	flseek(fin, 0L, SEEK_SET);

	OASIS_FLOAT tiv;
	unsigned int nrec = static_cast<unsigned int>(sz / sizeof(tiv));

	coverages.resize(nrec + 1);
	int coverage_id = 0;
	size_t i = fread(&tiv, sizeof(tiv), 1, fin);
	while (i != 0) {
		coverage_id++;
		coverages[coverage_id] = tiv;
		i = fread(&tiv, sizeof(tiv), 1, fin);
	}

	fclose(fin);

}